

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# putkey.c
# Opt level: O0

int ffu2c(ULONGLONG ival,char *cval,int *status)

{
  int iVar1;
  int *in_RDX;
  char *in_RSI;
  undefined8 in_RDI;
  int local_4;
  
  if (*in_RDX < 1) {
    *in_RSI = '\0';
    iVar1 = sprintf(in_RSI,"%llu",in_RDI);
    if (iVar1 < 0) {
      ffpmsg((char *)0x236d2b);
      *in_RDX = 0x191;
    }
    local_4 = *in_RDX;
  }
  else {
    local_4 = *in_RDX;
  }
  return local_4;
}

Assistant:

int ffu2c(ULONGLONG ival,  /* I - value to be converted to a string */
          char *cval,     /* O - character string representation of the value */
          int *status)    /* IO - error status */
/*
  convert  value to a null-terminated formatted string.
*/
{
    if (*status > 0)           /* inherit input status value if > 0 */
        return(*status);

    cval[0] = '\0';

#if defined(_MSC_VER)
    /* Microsoft Visual C++ 6.0 uses '%I64d' syntax  for 8-byte integers */
    if (sprintf(cval, "%I64u", ival) < 0)

#elif (USE_LL_SUFFIX == 1)
    if (sprintf(cval, "%llu", ival) < 0)
#else
    if (sprintf(cval, "%lu", ival) < 0)
#endif
    {
        ffpmsg("Error in ffu2c converting integer to string");
        *status = BAD_I2C;
    }
    return(*status);
}